

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall Operations::LoadProject(Operations *this,bool withLoc)

{
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Component_*>_>_>
  *components;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>_>
  *this_00;
  mapped_type *pmVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  undefined7 in_register_00000031;
  
  if ((int)this->loadStatus <= (int)CONCAT71(in_register_00000031,withLoc)) {
    components = &this->components;
    this_00 = &this->files;
    LoadFileList(&this->config,components,this_00,&this->projectRoot,this->inferredComponents,
                 withLoc);
    CreateIncludeLookupTable(this_00,&this->includeLookup,&this->collisions);
    MapFilesToComponents(components,this_00);
    ForgetEmptyComponents(components);
    if ((this->components)._M_h._M_element_count < 3) {
      std::operator<<((ostream *)&std::cout,
                      "Warning: Analyzing your project resulted in a very low amount of components. This either points to a small project, or\n"
                     );
      std::operator<<((ostream *)&std::cout,
                      "to cpp-dependencies not recognizing the components.\n\n");
      std::operator<<((ostream *)&std::cout,
                      "It tries to recognize components by the existence of project build files - CMakeLists.txt, Makefiles, MyProject.vcxproj\n"
                     );
      std::operator<<((ostream *)&std::cout,
                      "or similar files. If it does not recognize any such files, it will assume everything belongs to the project it is\n"
                     );
      std::operator<<((ostream *)&std::cout,
                      "contained in. You can invert this behaviour to assume that any code file will belong to a component local to it - in\n"
                     );
      std::operator<<((ostream *)&std::cout,
                      "effect, making every folder of code a single component - by using the --infer option.\n\n"
                     );
      std::operator<<((ostream *)&std::cout,
                      "Another reason for this warning may be running the tool in a folder that doesn\'t have any code. You can either change\n"
                     );
      std::operator<<((ostream *)&std::cout,
                      "to the desired directory, or use the --dir <myProject> option to make it analyze another directory.\n\n"
                     );
    }
    MapIncludesToDependencies(&this->includeLookup,&this->ambiguous,components,this_00);
    for (p_Var4 = (this->ambiguous)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &(this->ambiguous)._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      pmVar1 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&this->collisions,(key_type *)(p_Var4 + 1));
      for (p_Var3 = (pmVar1->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != &(pmVar1->_M_t)._M_impl.super__Rb_tree_header;
          p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
        iVar2 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&this_00->_M_h,(key_type *)(p_Var3 + 1));
        *(undefined1 *)
         ((long)iVar2.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_File>,_true>
                ._M_cur + 0x101) = 1;
      }
    }
    PropagateExternalIncludes(this_00);
    ExtractPublicDependencies(components);
    FindCircularDependencies(components);
    for (p_Var5 = (this->deleteComponents)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &(this->deleteComponents)._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
      KillComponent(components,(string *)(p_Var5 + 1));
    }
    this->loadStatus = withLoc + FastLoad;
    this->lastCommandDidNothing = false;
  }
  return;
}

Assistant:

void LoadProject(bool withLoc = false) {
        if (!withLoc && loadStatus >= FastLoad) return;
        if (withLoc && loadStatus >= FullLoad) return;
        LoadFileList(config, components, files, projectRoot, inferredComponents, withLoc);
        CreateIncludeLookupTable(files, includeLookup, collisions);
        MapFilesToComponents(components, files);
        ForgetEmptyComponents(components);
        if (components.size() < 3) {
            std::cout << "Warning: Analyzing your project resulted in a very low amount of components. This either points to a small project, or\n";
            std::cout << "to cpp-dependencies not recognizing the components.\n\n";

            std::cout << "It tries to recognize components by the existence of project build files - CMakeLists.txt, Makefiles, MyProject.vcxproj\n";
            std::cout << "or similar files. If it does not recognize any such files, it will assume everything belongs to the project it is\n";
            std::cout << "contained in. You can invert this behaviour to assume that any code file will belong to a component local to it - in\n";
            std::cout << "effect, making every folder of code a single component - by using the --infer option.\n\n";

            std::cout << "Another reason for this warning may be running the tool in a folder that doesn't have any code. You can either change\n";
            std::cout << "to the desired directory, or use the --dir <myProject> option to make it analyze another directory.\n\n";
        }
        MapIncludesToDependencies(includeLookup, ambiguous, components, files);
        for (auto &i : ambiguous) {
            for (auto &c : collisions[i.first]) {
                files.find(c)->second.hasInclude = true; // There is at least one include that might end up here.
            }
        }
        PropagateExternalIncludes(files);
        ExtractPublicDependencies(components);
        FindCircularDependencies(components);
        for (auto& c : deleteComponents) {
            KillComponent(components, c);
        }
        loadStatus = (withLoc ? FullLoad : FastLoad);
        lastCommandDidNothing = false;
    }